

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O3

void __thiscall icu_63::CalendarAstronomer::setJulianDay(CalendarAstronomer *this,double jdn)

{
  double dVar1;
  
  this->fTime = jdn * 86400000.0 + -210866760000000.0;
  dVar1 = uprv_getNaN_63();
  this->julianCentury = dVar1;
  this->sunLongitude = dVar1;
  this->meanAnomalySun = dVar1;
  this->moonLongitude = dVar1;
  this->moonEclipLong = dVar1;
  this->meanAnomalyMoon = dVar1;
  this->eclipObliquity = dVar1;
  this->siderealTime = dVar1;
  this->siderealT0 = dVar1;
  this->moonPositionSet = '\0';
  this->julianDay = jdn;
  return;
}

Assistant:

void CalendarAstronomer::setJulianDay(double jdn) {
    fTime = (double)(jdn * DAY_MS) + JULIAN_EPOCH_MS;
    clearCache();
    julianDay = jdn;
}